

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree * __thiscall
kj::StringTree::
concat<kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,StringTree *params,
          ArrayPtr<const_char> *params_1,String *params_2,ArrayPtr<const_char> *params_3,
          ArrayPtr<const_char> *params_4,ArrayPtr<const_char> *params_5,
          CappedArray<char,_14UL> *params_6,ArrayPtr<const_char> *params_7,StringTree *params_8,
          ArrayPtr<const_char> *params_9,String *params_10,ArrayPtr<const_char> *params_11,
          ArrayPtr<const_char> *params_12,ArrayPtr<const_char> *params_13,
          CappedArray<char,_14UL> *params_14,ArrayPtr<const_char> *params_15)

{
  size_t sVar1;
  StringTree *pSVar2;
  ArrayPtr<const_char> *pAVar3;
  String *pSVar4;
  CappedArray<char,_14UL> *pCVar5;
  char *pos;
  ArrayPtr<const_char> *rest_2;
  ArrayPtr<const_char> *rest_3;
  ArrayPtr<const_char> *rest_4;
  ArrayPtr<const_char> *rest_6;
  StringTree *rest_7;
  ArrayPtr<const_char> *rest_8;
  String *rest_9;
  ArrayPtr<const_char> *rest_10;
  ArrayPtr<const_char> *rest_11;
  ArrayPtr<const_char> *rest_12;
  CappedArray<char,_14UL> *rest_13;
  ArrayPtr<const_char> *rest_14;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  size_type extraout_RDX_01;
  initializer_list<unsigned_long> nums;
  initializer_list<unsigned_long> nums_00;
  initializer_list<unsigned_long> nums_01;
  size_t local_258;
  size_t local_250;
  size_t local_248;
  size_t local_240;
  size_t local_238;
  size_t local_230;
  size_t local_228;
  size_t local_220;
  size_t local_218;
  size_t local_210;
  size_t local_208;
  size_t local_200;
  size_t local_1f8;
  size_t local_1f0;
  size_t local_1e8;
  size_t local_1e0;
  _ *local_1d8;
  undefined8 local_1d0;
  Array<kj::StringTree::Branch> local_1c8;
  size_t local_1b0;
  size_t local_1a8;
  size_t local_1a0;
  size_t local_198;
  size_t local_190;
  size_t local_188;
  size_t local_180;
  size_t local_178;
  size_t local_170;
  size_t local_168;
  size_t local_160;
  size_t local_158;
  size_t local_150;
  size_t local_148;
  size_t local_140;
  size_t local_138;
  _ *local_130;
  undefined8 local_128;
  String local_120;
  size_t local_f8;
  size_t local_f0;
  size_t local_e8;
  size_t local_e0;
  size_t local_d8;
  size_t local_d0;
  size_t local_c8;
  size_t local_c0;
  size_t local_b8;
  size_t local_b0;
  size_t local_a8;
  size_t local_a0;
  size_t local_98;
  size_t local_90;
  size_t local_88;
  size_t local_80;
  _ *local_78;
  undefined8 local_70;
  undefined1 local_61;
  ArrayPtr<const_char> *local_60;
  ArrayPtr<const_char> *params_local_4;
  ArrayPtr<const_char> *params_local_3;
  String *params_local_2;
  ArrayPtr<const_char> *params_local_1;
  StringTree *params_local;
  StringTree *result;
  
  local_61 = 0;
  local_60 = params_3;
  params_local_4 = (ArrayPtr<const_char> *)params_2;
  params_local_3 = params_1;
  params_local_2 = (String *)params;
  params_local_1 = (ArrayPtr<const_char> *)this;
  params_local = __return_storage_ptr__;
  StringTree(__return_storage_ptr__);
  local_f8 = size((StringTree *)params_local_1);
  local_f0 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)params_local_2);
  local_e8 = String::size((String *)params_local_3);
  local_e0 = ArrayPtr<const_char>::size(params_local_4);
  local_d8 = ArrayPtr<const_char>::size(local_60);
  local_d0 = ArrayPtr<const_char>::size(params_4);
  local_c8 = CappedArray<char,_14UL>::size((CappedArray<char,_14UL> *)params_5);
  local_c0 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)params_6);
  local_b8 = size((StringTree *)params_7);
  local_b0 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)params_8);
  local_a8 = String::size((String *)params_9);
  local_a0 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)params_10);
  local_98 = ArrayPtr<const_char>::size(params_11);
  local_90 = ArrayPtr<const_char>::size(params_12);
  local_88 = CappedArray<char,_14UL>::size((CappedArray<char,_14UL> *)params_13);
  local_80 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)params_14);
  local_78 = (_ *)&local_f8;
  local_70 = 0x10;
  nums._M_len = extraout_RDX;
  nums._M_array = (iterator)0x10;
  sVar1 = _::sum(local_78,nums);
  __return_storage_ptr__->size_ = sVar1;
  pSVar2 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_local_1);
  local_1b0 = flatSize(pSVar2);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_local_2);
  local_1a8 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pSVar4 = fwd<kj::String>((NoInfer<kj::String> *)params_local_3);
  local_1a0 = flatSize(pSVar4);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_local_4);
  local_198 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(local_60);
  local_190 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_4);
  local_188 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pCVar5 = fwd<kj::CappedArray<char,14ul>>((NoInfer<kj::CappedArray<char,_14UL>_> *)params_5);
  local_180 = flatSize<kj::CappedArray<char,14ul>>(pCVar5);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_6);
  local_178 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pSVar2 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_7);
  local_170 = flatSize(pSVar2);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_8);
  local_168 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pSVar4 = fwd<kj::String>((NoInfer<kj::String> *)params_9);
  local_160 = flatSize(pSVar4);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_10);
  local_158 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_11);
  local_150 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_12);
  local_148 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pCVar5 = fwd<kj::CappedArray<char,14ul>>((NoInfer<kj::CappedArray<char,_14UL>_> *)params_13);
  local_140 = flatSize<kj::CappedArray<char,14ul>>(pCVar5);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_14);
  local_138 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  local_130 = (_ *)&local_1b0;
  local_128 = 0x10;
  nums_00._M_len = extraout_RDX_00;
  nums_00._M_array = (iterator)0x10;
  sVar1 = _::sum(local_130,nums_00);
  heapString(&local_120,sVar1);
  String::operator=(&__return_storage_ptr__->text,&local_120);
  String::~String(&local_120);
  pSVar2 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_local_1);
  local_258 = branchCount(pSVar2);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_local_2);
  local_250 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pSVar4 = fwd<kj::String>((NoInfer<kj::String> *)params_local_3);
  local_248 = branchCount(pSVar4);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_local_4);
  local_240 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(local_60);
  local_238 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_4);
  local_230 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pCVar5 = fwd<kj::CappedArray<char,14ul>>((NoInfer<kj::CappedArray<char,_14UL>_> *)params_5);
  local_228 = branchCount<kj::CappedArray<char,14ul>>(pCVar5);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_6);
  local_220 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pSVar2 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_7);
  local_218 = branchCount(pSVar2);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_8);
  local_210 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pSVar4 = fwd<kj::String>((NoInfer<kj::String> *)params_9);
  local_208 = branchCount(pSVar4);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_10);
  local_200 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_11);
  local_1f8 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_12);
  local_1f0 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pCVar5 = fwd<kj::CappedArray<char,14ul>>((NoInfer<kj::CappedArray<char,_14UL>_> *)params_13);
  local_1e8 = branchCount<kj::CappedArray<char,14ul>>(pCVar5);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_14);
  local_1e0 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  local_1d8 = (_ *)&local_258;
  local_1d0 = 0x10;
  nums_01._M_len = extraout_RDX_01;
  nums_01._M_array = (iterator)0x10;
  sVar1 = _::sum(local_1d8,nums_01);
  heapArray<kj::StringTree::Branch>(&local_1c8,sVar1);
  Array<kj::StringTree::Branch>::operator=(&__return_storage_ptr__->branches,&local_1c8);
  Array<kj::StringTree::Branch>::~Array(&local_1c8);
  pos = String::begin(&__return_storage_ptr__->text);
  pSVar2 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_local_1);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_local_2);
  pSVar4 = fwd<kj::String>((NoInfer<kj::String> *)params_local_3);
  rest_2 = fwd<kj::ArrayPtr<char_const>>(params_local_4);
  rest_3 = fwd<kj::ArrayPtr<char_const>>(local_60);
  rest_4 = fwd<kj::ArrayPtr<char_const>>(params_4);
  pCVar5 = fwd<kj::CappedArray<char,14ul>>((NoInfer<kj::CappedArray<char,_14UL>_> *)params_5);
  rest_6 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_6);
  rest_7 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_7);
  rest_8 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_8);
  rest_9 = fwd<kj::String>((NoInfer<kj::String> *)params_9);
  rest_10 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_10);
  rest_11 = fwd<kj::ArrayPtr<char_const>>(params_11);
  rest_12 = fwd<kj::ArrayPtr<char_const>>(params_12);
  rest_13 = fwd<kj::CappedArray<char,14ul>>((NoInfer<kj::CappedArray<char,_14UL>_> *)params_13);
  rest_14 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_14);
  fill<kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pos,0,pSVar2,pAVar3,pSVar4,rest_2,rest_3,rest_4,pCVar5,rest_6,
             rest_7,rest_8,rest_9,rest_10,rest_11,rest_12,rest_13,rest_14);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}